

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strpbrk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  uint uVar1;
  sxi32 sVar2;
  char *zStr;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  sxu32 nMax;
  int iListLen;
  int iLen;
  sxu32 local_40;
  int local_3c;
  sxu32 local_38;
  sxu32 local_34;
  
  if (1 < nArg) {
    zStr = jx9_value_to_string(*apArg,(int *)&local_34);
    pcVar3 = jx9_value_to_string(apArg[1],&local_3c);
    if (0 < (int)local_34) {
      local_38 = local_34;
      local_40 = 0xffffffff;
      if (local_3c < 1) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = 0xffffffff;
        lVar4 = 0;
        do {
          sVar2 = SyByteFind(zStr,local_34,(int)pcVar3[lVar4],&local_40);
          uVar1 = local_40;
          if (uVar5 <= local_40) {
            uVar1 = uVar5;
          }
          if (sVar2 == 0) {
            uVar5 = uVar1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < local_3c);
      }
      if (uVar5 != 0xffffffff) {
        jx9_value_string(pCtx->pRet,zStr + uVar5,local_38 - uVar5);
        return 0;
      }
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strpbrk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zList, *zEnd;
	int iLen, iListLen, i, c;
	sxu32 nOfft, nMax;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack and the char list */
	zString = jx9_value_to_string(apArg[0], &iLen);
	zList = jx9_value_to_string(apArg[1], &iListLen);
	if( iLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	nOfft = nMax = SXU32_HIGH;
	/* perform the requested operation */
	for( i = 0 ; i < iListLen ; i++ ){
		c = zList[i];
		rc = SyByteFind(zString, (sxu32)iLen, c, &nMax);
		if( rc == SXRET_OK ){
			if( nMax < nOfft ){
				nOfft = nMax;
			}
		}
	}
	if( nOfft == SXU32_HIGH ){
		/* No such substring, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the substring */
		jx9_result_string(pCtx, &zString[nOfft], (int)(zEnd-&zString[nOfft]));
	}
	return JX9_OK;
}